

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_units.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Surface *this;
  undefined1 local_50 [8];
  SDLBackend backend;
  char **argv_local;
  int argc_local;
  
  backend._48_8_ = argv;
  rengine::SDLBackend::SDLBackend((SDLBackend *)local_50);
  this = (Surface *)operator_new(0x10);
  rengine::Surface::Surface(this);
  surface = this;
  tst_dpi();
  rengine::SDLBackend::~SDLBackend((SDLBackend *)local_50);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    RENGINE_BACKEND backend;
    surface = new Surface();

    tst_dpi();

    return 0;
}